

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I422ToRGB565Row_SSSE3
               (uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_rgb565,
               YuvConstants *yuvconstants,int width)

{
  int iVar1;
  ulong uVar2;
  int width_00;
  ulong uVar3;
  uint8_t row [8192];
  uint8_t local_2060 [8240];
  
  if (0 < width) {
    uVar2 = (ulong)(uint)width;
    do {
      iVar1 = (int)uVar2;
      uVar3 = 0x800;
      if (iVar1 < 0x800) {
        uVar3 = uVar2;
      }
      width_00 = (int)uVar3;
      I422ToARGBRow_SSSE3(src_y,src_u,src_v,local_2060,yuvconstants,width_00);
      ARGBToRGB565Row_SSE2(local_2060,dst_rgb565,width_00);
      src_y = src_y + uVar3;
      src_u = src_u + (uVar3 >> 1);
      src_v = src_v + (uVar3 >> 1);
      dst_rgb565 = dst_rgb565 + uVar3 * 2;
      uVar2 = (ulong)(uint)(iVar1 - width_00);
    } while (iVar1 - width_00 != 0 && width_00 <= iVar1);
  }
  return;
}

Assistant:

void I422ToRGB565Row_SSSE3(const uint8_t* src_y,
                           const uint8_t* src_u,
                           const uint8_t* src_v,
                           uint8_t* dst_rgb565,
                           const struct YuvConstants* yuvconstants,
                           int width) {
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    I422ToARGBRow_SSSE3(src_y, src_u, src_v, row, yuvconstants, twidth);
    ARGBToRGB565Row_SSE2(row, dst_rgb565, twidth);
    src_y += twidth;
    src_u += twidth / 2;
    src_v += twidth / 2;
    dst_rgb565 += twidth * 2;
    width -= twidth;
  }
}